

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::ifStmt(Parser *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Lexer *pLVar4;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Report *this_00;
  undefined4 uVar8;
  undefined8 uVar9;
  ASTNode *pAVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  int iVar13;
  LiteralType args;
  Expr *pEVar14;
  long *plVar15;
  _Head_base<0UL,_flow::lang::Expr_*,_false> _Var16;
  undefined8 *puVar17;
  pointer *__ptr;
  Parser *in_RSI;
  _Base_ptr p_Var18;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> thenStmt;
  size_type __dnew;
  SourceLocation sloc;
  _Head_base<0UL,_flow::lang::Expr_*,_false> local_98;
  string local_90;
  _Base_ptr local_70;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_68;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_60;
  SymbolTable *local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int iStack_38;
  uint uStack_34;
  
  pLVar4 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  local_68._M_head_impl = (Lexer *)&stack0xffffffffffffffa8;
  lVar5 = *(long *)&(pLVar4->location_).filename._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,lVar5,(pLVar4->location_).filename._M_string_length + lVar5);
  uVar1 = (pLVar4->location_).end.column;
  uVar6 = (pLVar4->location_).end.offset;
  _local_48 = *(undefined8 *)&(pLVar4->location_).begin;
  uVar9 = *(undefined8 *)&(pLVar4->location_).begin.offset;
  uStack_40 = (undefined4)uVar9;
  uStack_3c = (undefined4)((ulong)uVar9 >> 0x20);
  iStack_38 = uVar1;
  uStack_34 = uVar6;
  bVar12 = expect(in_RSI,If);
  if (bVar12) {
    Lexer::nextToken((in_RSI->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
  }
  logicExpr((Parser *)&local_98);
  pLVar4 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  if (pLVar4->token_ == Then) {
    Lexer::nextToken(pLVar4);
  }
  iVar13 = (*((ASTNode *)&((local_98._M_head_impl)->super_ASTNode)._vptr_ASTNode)->_vptr_ASTNode[3])
                     ();
  _Var16._M_head_impl = local_98._M_head_impl;
  if (iVar13 != 1) {
    if (iVar13 != 3) {
      pLVar4 = (in_RSI->lexer_)._M_t.
               super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
               _M_t.
               super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
               super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
      this_00 = in_RSI->report_;
      local_70 = (_Base_ptr)0x3d;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_70);
      local_90.field_2._M_allocated_capacity = (size_type)local_70;
      builtin_strncpy((char *)((long)local_90._M_dataplus._M_p + 0x2d),"type {} ",8);
      builtin_strncpy((char *)((long)local_90._M_dataplus._M_p + 0x35),"instead.",8);
      *(undefined8 *)((long)local_90._M_dataplus._M_p + 0x20) = 0x65636552202e6570;
      *(undefined8 *)((long)local_90._M_dataplus._M_p + 0x28) = 0x7079742064657669;
      *(undefined8 *)((long)local_90._M_dataplus._M_p + 0x10) = 0x6f62206562207473;
      *(undefined8 *)((long)local_90._M_dataplus._M_p + 0x18) = 0x7974206e61656c6f;
      *(undefined4 *)local_90._M_dataplus._M_p = 0x65206649;
      builtin_strncpy((char *)((long)local_90._M_dataplus._M_p + 4),"xpre",4);
      *(undefined4 *)((long)local_90._M_dataplus._M_p + 8) = 0x6f697373;
      builtin_strncpy((char *)((long)local_90._M_dataplus._M_p + 0xc),"n mu",4);
      local_90._M_string_length = (size_type)local_70;
      *(char *)((long)&local_70->_M_color + (long)local_90._M_dataplus._M_p) = '\0';
      args = (*((ASTNode *)&((local_98._M_head_impl)->super_ASTNode)._vptr_ASTNode)->_vptr_ASTNode
               [3])();
      diagnostics::Report::typeError<flow::LiteralType>
                (this_00,&pLVar4->lastLocation_,&local_90,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        (ulong)(local_90.field_2._M_allocated_capacity + 1));
      }
      *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
      goto LAB_00127f5c;
    }
    pLVar4 = (in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    uStack_34 = (pLVar4->lastLocation_).end.offset;
    uVar2 = (pLVar4->lastLocation_).end.line;
    uVar7 = (pLVar4->lastLocation_).end.column;
    uStack_3c = uVar2;
    iStack_38 = uVar7;
    pEVar14 = (Expr *)operator_new(0x50);
    (pEVar14->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001947b0;
    (pEVar14->super_ASTNode).location_.filename._M_dataplus._M_p =
         (pointer)&(pEVar14->super_ASTNode).location_.filename.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pEVar14->super_ASTNode).location_,local_68._M_head_impl,
               (undefined1 *)((long)local_60._M_head_impl + (long)local_68._M_head_impl));
    (pEVar14->super_ASTNode).location_.end.column = iStack_38;
    (pEVar14->super_ASTNode).location_.end.offset = uStack_34;
    *(undefined8 *)&(pEVar14->super_ASTNode).location_.begin = _local_48;
    *(ulong *)&(pEVar14->super_ASTNode).location_.begin.offset = CONCAT44(uStack_3c,uStack_40);
    (pEVar14->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__UnaryExpr_00194b48;
    *(undefined2 *)&pEVar14[1].super_ASTNode._vptr_ASTNode = 0x37;
    pEVar14[1].super_ASTNode.location_.filename._M_dataplus._M_p = (pointer)local_98._M_head_impl;
    local_98._M_head_impl = pEVar14;
    plVar15 = (long *)operator_new(0x48);
    *plVar15 = (long)&PTR__ASTNode_001947b0;
    plVar15[1] = (long)(plVar15 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(plVar15 + 1),local_68._M_head_impl,
               (undefined1 *)
               ((long)&(((list_type *)&(local_60._M_head_impl)->report_)->
                       super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + (long)local_68._M_head_impl));
    plVar15[7] = CONCAT44(uStack_34,iStack_38);
    plVar15[5] = _local_48;
    plVar15[6] = CONCAT44(uStack_3c,uStack_40);
    *plVar15 = (long)&PTR__ASTNode_00194808;
    plVar15[8] = 0;
    _Var16._M_head_impl = (Expr *)operator_new(0x58);
    local_90._M_dataplus._M_p = (pointer)plVar15;
    BinaryExpr::BinaryExpr
              ((BinaryExpr *)_Var16._M_head_impl,NCMPNE,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_98,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_90);
    if ((long *)local_90._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
    }
    if (local_98._M_head_impl != (Expr *)0x0) {
      pAVar10 = &(local_98._M_head_impl)->super_ASTNode;
      local_98._M_head_impl = _Var16._M_head_impl;
      (*pAVar10->_vptr_ASTNode[1])();
      _Var16._M_head_impl = local_98._M_head_impl;
    }
  }
  local_98._M_head_impl = _Var16._M_head_impl;
  stmt((Parser *)&local_90);
  if ((long *)local_90._M_dataplus._M_p == (long *)0x0) {
LAB_00127df7:
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
    puVar17 = (undefined8 *)0x0;
  }
  else {
    pLVar4 = (in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    if (pLVar4->token_ == Else) {
      Lexer::nextToken(pLVar4);
      stmt((Parser *)&local_70);
      p_Var18 = local_70;
      if (local_70 == (_Base_ptr)0x0) goto LAB_00127df7;
    }
    else {
      p_Var18 = (_Base_ptr)0x0;
    }
    pLVar4 = (in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    uStack_34 = (pLVar4->lastLocation_).end.offset;
    uVar3 = (pLVar4->lastLocation_).end.line;
    uVar8 = (pLVar4->lastLocation_).end.column;
    uStack_3c = uVar3;
    iStack_38 = uVar8;
    puVar17 = (undefined8 *)operator_new(0x58);
    _Var11._M_p = local_90._M_dataplus._M_p;
    _Var16._M_head_impl = local_98._M_head_impl;
    local_98._M_head_impl = (Expr *)0x0;
    local_90._M_dataplus._M_p = (pointer)0x0;
    *puVar17 = &PTR__ASTNode_001947b0;
    puVar17[1] = puVar17 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar17 + 1),local_68._M_head_impl,
               (undefined1 *)((long)local_60._M_head_impl + (long)local_68._M_head_impl));
    puVar17[7] = CONCAT44(uStack_34,iStack_38);
    *(undefined4 *)(puVar17 + 5) = local_48;
    *(undefined4 *)((long)puVar17 + 0x2c) = uStack_44;
    *(undefined4 *)(puVar17 + 6) = uStack_40;
    *(undefined4 *)((long)puVar17 + 0x34) = uStack_3c;
    *puVar17 = &PTR__CondStmt_00194d70;
    puVar17[8] = _Var16._M_head_impl;
    puVar17[9] = _Var11._M_p;
    puVar17[10] = p_Var18;
  }
  *(undefined8 **)&(this->features_)._M_t._M_impl = puVar17;
  if ((long *)local_90._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
  }
LAB_00127f5c:
  if ((BinaryExpr *)local_98._M_head_impl != (BinaryExpr *)0x0) {
    (*((ASTNode *)&((local_98._M_head_impl)->super_ASTNode)._vptr_ASTNode)->_vptr_ASTNode[1])();
  }
  if (local_68._M_head_impl != (Lexer *)&stack0xffffffffffffffa8) {
    operator_delete(local_68._M_head_impl,
                    (ulong)((long)&(local_58->symbols_).
                                   super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::ifStmt() {
  // ifStmt ::= 'if' expr ['then'] stmt ['else' stmt]
  SourceLocation sloc(location());

  consume(Token::If);
  std::unique_ptr<Expr> cond(expr());
  consumeIf(Token::Then);

  switch (cond->getType()) {
    case LiteralType::Boolean:
      break;
    case LiteralType::String:
      cond = std::make_unique<UnaryExpr>(Opcode::SLEN, std::move(cond), sloc.update(end()));
      cond = std::make_unique<BinaryExpr>(Opcode::NCMPNE, std::move(cond),
          std::make_unique<NumberExpr>(0, sloc));
      break;
    default:
      report_.typeError(
          lastLocation(),
          "If expression must be boolean type. Received type {} instead.",
          cond->getType());
      return nullptr;
  }

  std::unique_ptr<Stmt> thenStmt(stmt());
  if (!thenStmt) return nullptr;

  std::unique_ptr<Stmt> elseStmt;

  if (consumeIf(Token::Else)) {
    elseStmt = stmt();
    if (!elseStmt) {
      return nullptr;
    }
  }

  return std::make_unique<CondStmt>(std::move(cond), std::move(thenStmt),
                                    std::move(elseStmt), sloc.update(end()));
}